

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

int cdef_find_dir_avx2(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  uint in_ECX;
  int *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZMM0 [64];
  v128 t;
  v128 max;
  v128 dir03;
  v128 dir47;
  v128 lines [8];
  int best_dir;
  int32_t best_cost;
  int32_t cost [8];
  int i;
  undefined8 local_428;
  undefined8 uStackY_420;
  undefined8 local_418;
  undefined8 uStackY_410;
  undefined8 local_408;
  undefined8 uStackY_400;
  undefined8 local_3f8;
  undefined8 uStackY_3f0;
  undefined8 local_3e8 [5];
  v128 *in_stack_fffffffffffffc40;
  v128 *in_stack_fffffffffffffc48;
  int local_358 [10];
  int local_330;
  int *local_328;
  undefined1 (*local_310) [16];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined2 local_2ba;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 (*local_e0) [16];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_8a;
  undefined1 local_88 [16];
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  for (local_330 = 0; auVar7 = in_ZMM0._0_16_, local_330 < 8; local_330 = local_330 + 1) {
    local_310 = (undefined1 (*) [16])(in_RDI + (long)(local_330 * in_ESI) * 2);
    local_e0 = local_310;
    auVar7 = vlddqu_avx(*local_310);
    *(undefined1 (*) [16])(local_3e8 + (long)local_330 * 2) = auVar7;
    local_2d8 = local_3e8[(long)local_330 * 2];
    uStack_2d0 = local_3e8[(long)local_330 * 2 + 1];
    local_1b8 = ZEXT416(in_ECX);
    auVar8 = local_1b8;
    local_1b8._4_4_ = 0;
    local_1b8._0_4_ = in_ECX;
    local_a8 = local_2d8;
    uStack_a0 = uStack_2d0;
    local_b8 = local_1b8._0_8_;
    uStack_b0 = 0;
    auVar1._8_8_ = uStack_2d0;
    auVar1._0_8_ = local_2d8;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1b8._0_8_;
    local_2f8 = vpsraw_avx(auVar1,auVar7);
    local_2ba = 0x80;
    local_8a = 0x80;
    local_6a = 0x80;
    local_6c = 0x80;
    local_6e = 0x80;
    local_70 = 0x80;
    local_72 = 0x80;
    local_74 = 0x80;
    local_76 = 0x80;
    local_78 = 0x80;
    auVar7 = vpinsrw_avx(ZEXT216(0x80),0x80,1);
    auVar7 = vpinsrw_avx(auVar7,0x80,2);
    auVar7 = vpinsrw_avx(auVar7,0x80,3);
    auVar7 = vpinsrw_avx(auVar7,0x80,4);
    auVar7 = vpinsrw_avx(auVar7,0x80,5);
    auVar7 = vpinsrw_avx(auVar7,0x80,6);
    local_88 = vpinsrw_avx(auVar7,0x80,7);
    auVar4 = local_88;
    auVar1 = local_2f8;
    local_308 = local_88._0_8_;
    uStack_300 = local_88._8_8_;
    local_c8 = local_2f8._0_8_;
    uStack_c0 = local_2f8._8_8_;
    local_d8 = local_88._0_8_;
    uStack_d0 = local_88._8_8_;
    auVar7 = vpsubw_avx(local_2f8,local_88);
    in_ZMM0 = ZEXT1664(auVar7);
    *(undefined1 (*) [16])(local_3e8 + (long)local_330 * 2) = auVar7;
    local_2f8 = auVar1;
    local_1b8 = auVar8;
    local_88 = auVar4;
  }
  local_328 = in_RDX;
  compute_directions(in_stack_fffffffffffffc48,(int32_t *)in_stack_fffffffffffffc40);
  auVar8 = auVar7;
  array_reverse_transpose_8x8(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  compute_directions(in_stack_fffffffffffffc48,(int32_t *)in_stack_fffffffffffffc40);
  local_408 = auVar8._0_8_;
  uStackY_400 = auVar8._8_8_;
  local_3f8 = auVar7._0_8_;
  uStackY_3f0 = auVar7._8_8_;
  local_268 = local_408;
  uStack_260 = uStackY_400;
  local_278 = local_3f8;
  uStack_270 = uStackY_3f0;
  local_58 = local_408;
  uStack_50 = uStackY_400;
  local_68 = local_3f8;
  uStack_60 = uStackY_3f0;
  local_288 = vpmaxsd_avx(auVar8,auVar7);
  local_298 = vpshufd_avx(local_288,0x4e);
  local_38 = local_288._0_8_;
  uStack_30 = local_288._8_8_;
  local_48 = local_298._0_8_;
  uStack_40 = local_298._8_8_;
  local_2a8 = vpmaxsd_avx(local_288,local_298);
  local_2b8 = vpshufd_avx(local_2a8,0x39);
  local_18 = local_2a8._0_8_;
  uStack_10 = local_2a8._8_8_;
  local_28 = local_2b8._0_8_;
  uStack_20 = local_2b8._8_8_;
  auVar1 = vpmaxsd_avx(local_2a8,local_2b8);
  local_418 = auVar1._0_8_;
  uStackY_410 = auVar1._8_8_;
  local_258 = local_418;
  uStack_250 = uStackY_410;
  local_128 = local_418;
  uStack_120 = uStackY_410;
  local_138 = local_418;
  uVar3 = local_138;
  uStack_130 = uStackY_410;
  local_138._0_4_ = auVar1._0_4_;
  iVar2 = (int)local_138;
  local_1f8 = local_418;
  uStack_1f0 = uStackY_410;
  local_208 = local_3f8;
  uStack_200 = uStackY_3f0;
  local_188 = local_418;
  uStack_180 = uStackY_410;
  local_198 = local_3f8;
  uStack_190 = uStackY_3f0;
  local_238 = vpcmpeqd_avx(auVar1,auVar7);
  local_218 = local_418;
  uStack_210 = uStackY_410;
  local_228 = local_408;
  uStack_220 = uStackY_400;
  local_168 = local_418;
  uStack_160 = uStackY_410;
  local_178 = local_408;
  uStack_170 = uStackY_400;
  local_248 = vpcmpeqd_avx(auVar1,auVar8);
  local_148 = local_248._0_8_;
  uStack_140 = local_248._8_8_;
  local_158 = local_238._0_8_;
  uStack_150 = local_238._8_8_;
  auVar7 = vpackssdw_avx(local_248,local_238);
  local_428 = auVar7._0_8_;
  uStackY_420 = auVar7._8_8_;
  local_1c8 = local_428;
  uStack_1c0 = uStackY_420;
  local_1d8 = local_428;
  uStack_1d0 = uStackY_420;
  local_f8 = local_428;
  uStack_f0 = uStackY_420;
  local_108 = local_428;
  uStack_100 = uStackY_420;
  local_1e8 = vpacksswb_avx(auVar7,auVar7);
  local_118 = local_1e8._0_8_;
  uStack_110 = local_1e8._8_8_;
  uVar5 = (uint)(ushort)((ushort)(SUB161(local_1e8 >> 7,0) & 1) |
                         (ushort)(SUB161(local_1e8 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(local_1e8 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(local_1e8 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(local_1e8 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(local_1e8 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(local_1e8 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(local_1e8 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(local_1e8 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(local_1e8 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(local_1e8 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(local_1e8 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(local_1e8 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(local_1e8 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(local_1e8 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(local_1e8[0xf] >> 7) << 0xf);
  local_138 = uVar3;
  iVar6 = get_msb(uVar5 ^ uVar5 - 1);
  *local_328 = iVar2 - local_358[(int)(iVar6 + 4U & 7)];
  *local_328 = *local_328 >> 10;
  return iVar6;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}